

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O0

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,String *val)

{
  element_type *peVar1;
  char *__s;
  char *buffer_1;
  char buffer [1024];
  uint local_1c;
  String *pSStack_18;
  uint32_t length;
  String *val_local;
  BinaryReader *this_local;
  
  pSStack_18 = val;
  val_local = (String *)this;
  peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )this);
  Buffer::Read(peVar1,&this->m_pos,&local_1c,4);
  if (local_1c < 0x3ff) {
    peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    Buffer::Read(peVar1,&this->m_pos,&buffer_1,(ulong)(local_1c + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (pSStack_18,(char *)&buffer_1);
  }
  else {
    __s = (char *)MemAllocate((ulong)(local_1c + 2));
    peVar1 = std::__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    Buffer::Read(peVar1,&this->m_pos,__s,(ulong)(local_1c + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (pSStack_18,__s);
    MemFree(__s,(ulong)(local_1c + 1));
  }
  return;
}

Assistant:

inline_t void BinaryReader::Read(String * val)
	{
		uint32_t length;
		m_buffer->Read(&m_pos, &length, sizeof(length));
		if (length < (1024 - 1))
		{
			char buffer[1024];
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
		}
		else
		{
			char * buffer = (char *)MemAllocate(length + 2);
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
			MemFree(buffer, length + 1);
		}
	}